

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatusFunction.hpp
# Opt level: O0

void __thiscall
OpenMD::DumpStatusFunction::DumpStatusFunction(DumpStatusFunction *this,SimInfo *info)

{
  Globals *this_00;
  element_type *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ForceField *in_RSI;
  SimInfo *in_RDI;
  Stats *in_stack_00000020;
  string *in_stack_00000028;
  StatWriter *in_stack_00000030;
  StatsBitSet mask;
  SimInfo *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  undefined1 __val;
  StatsBitSet *__position;
  string local_50 [24];
  SimInfo *in_stack_ffffffffffffffc8;
  DumpWriter *in_stack_ffffffffffffffd0;
  StatsBitSet local_28 [3];
  ForceField *local_10;
  
  __val = (undefined1)((ulong)in_stack_ffffffffffffff80 >> 0x38);
  in_RDI->_vptr_SimInfo = (_func_int **)0x0;
  local_10 = in_RSI;
  StatusFunction::StatusFunction((StatusFunction *)in_RDI);
  in_RDI->_vptr_SimInfo = (_func_int **)&PTR__DumpStatusFunction_004fca60;
  in_RDI->forceField_ = local_10;
  this_00 = (Globals *)operator_new(0x68);
  Stats::Stats((Stats *)this_00,in_RDI);
  in_RDI->simParams_ = this_00;
  this_01 = (element_type *)operator_new(0x60);
  DumpWriter::DumpWriter(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  (in_RDI->randNumGen_).super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = this_01;
  __position = local_28;
  std::bitset<46UL>::bitset((bitset<46UL> *)0x133f5c);
  std::bitset<46UL>::set((bitset<46UL> *)this_01,(size_t)__position,(bool)__val);
  std::bitset<46UL>::set((bitset<46UL> *)this_01,(size_t)__position,(bool)__val);
  Stats::setStatsMask((Stats *)in_RDI->simParams_,local_28[0]);
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x448);
  SimInfo::getStatFileName_abi_cxx11_(in_stack_ffffffffffffff78);
  StatWriter::StatWriter(in_stack_00000030,in_stack_00000028,in_stack_00000020);
  (in_RDI->randNumGen_).super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

DumpStatusFunction(SimInfo* info) : StatusFunction(), info_(info) {
      stats      = new Stats(info_);
      dumpWriter = new DumpWriter(info_);
      Stats::StatsBitSet mask;
      mask.set(Stats::TIME);
      mask.set(Stats::POTENTIAL_ENERGY);
      stats->setStatsMask(mask);
      statWriter = new StatWriter(info_->getStatFileName(), stats);
    }